

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

void duckdb::PhysicalCopyToFile::ReturnStatistics
               (DataChunk *chunk,idx_t row_idx,CopyToFileInfo *info)

{
  pointer *ppVVar1;
  type pCVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  __node_base *p_Var5;
  _Hash_node_base *p_Var6;
  vector<duckdb::Value,_true> stats_values;
  LogicalType map_val_type;
  vector<duckdb::Value,_true> values;
  vector<duckdb::Value,_true> local_1d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_1b8;
  vector<duckdb::Value,_true> keys;
  pointer local_118;
  pointer pVStack_110;
  pointer local_108;
  LogicalType local_100;
  LogicalType local_e8;
  LogicalType local_d0;
  vector<duckdb::Value,_true> local_b8;
  vector<duckdb::Value,_true> local_98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  stats;
  string local_50;
  
  pCVar2 = unique_ptr<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>,_true>
           ::operator*(&info->file_stats);
  ::std::__cxx11::string::string((string *)&local_50,(string *)info);
  Value::Value((Value *)&local_1b8,&local_50);
  DataChunk::SetValue(chunk,0,row_idx,(Value *)&local_1b8);
  Value::~Value((Value *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_50);
  Value::UBIGINT((Value *)&local_1b8,pCVar2->row_count);
  DataChunk::SetValue(chunk,1,row_idx,(Value *)&local_1b8);
  Value::~Value((Value *)&local_1b8);
  Value::UBIGINT((Value *)&local_1b8,pCVar2->file_size_bytes);
  DataChunk::SetValue(chunk,2,row_idx,(Value *)&local_1b8);
  Value::~Value((Value *)&local_1b8);
  DataChunk::SetValue(chunk,3,row_idx,&pCVar2->footer_size_bytes);
  stats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &stats._M_t._M_impl.super__Rb_tree_header._M_header;
  stats._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stats._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = &(pCVar2->column_statistics)._M_h._M_before_begin;
  ppVVar1 = &values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
  stats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       stats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffff00000000);
    values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var6 = p_Var5 + 7;
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::pair<duckdb::Value_&,_true>
                (&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1),
                 (Value *)(p_Var6 + 5));
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,duckdb::Value>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
                  *)&values,&local_1b8);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::~pair(&local_1b8);
    }
    map_val_type.id_ = INVALID;
    map_val_type.physical_type_ = ~INVALID;
    map_val_type._2_6_ = 0;
    map_val_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    map_val_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var3 = (_Rb_tree_node_base *)ppVVar1; p_Var3 != (_Rb_tree_node_base *)ppVVar1;
        p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3)) {
      ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&map_val_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&stats_values,
                 (Value *)(p_Var3 + 2));
    }
    LogicalType::LogicalType((LogicalType *)&local_1b8,VARCHAR);
    LogicalType::LogicalType(&local_d0,VARCHAR);
    local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)map_val_type._0_8_;
    local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)map_val_type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)map_val_type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    map_val_type.id_ = INVALID;
    map_val_type.physical_type_ = ~INVALID;
    map_val_type._2_6_ = 0;
    map_val_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    map_val_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118 = stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start;
    pVStack_110 = stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_108 = stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    stats_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::MAP((Value *)&keys,(LogicalType *)&local_1b8,&local_d0,&local_1d8,
               (vector<duckdb::Value,_true> *)&local_118);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_118);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1d8);
    LogicalType::~LogicalType(&local_d0);
    LogicalType::~LogicalType((LogicalType *)&local_1b8);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::pair<duckdb::Value,_true>
              (&local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 1),
               (Value *)&keys);
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,duckdb::Value>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
                *)&stats,&local_1b8);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair(&local_1b8);
    Value::~Value((Value *)&keys);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&stats_values);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&map_val_type);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)&values);
  }
  keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (p_Var4 = stats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &stats._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4)) {
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&keys,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1));
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values,
               (Value *)(p_Var4 + 2));
  }
  LogicalType::LogicalType(&local_e8,VARCHAR);
  LogicalType::LogicalType(&local_100,VARCHAR);
  LogicalType::MAP(&map_val_type,&local_e8,&local_100);
  LogicalType::~LogicalType(&local_100);
  LogicalType::~LogicalType(&local_e8);
  LogicalType::LogicalType((LogicalType *)&stats_values,VARCHAR);
  local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::MAP((Value *)&local_1b8,(LogicalType *)&stats_values,&map_val_type,&local_98,&local_b8);
  DataChunk::SetValue(chunk,4,row_idx,(Value *)&local_1b8);
  Value::~Value((Value *)&local_1b8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98);
  LogicalType::~LogicalType((LogicalType *)&stats_values);
  DataChunk::SetValue(chunk,5,row_idx,&info->partition_keys);
  LogicalType::~LogicalType(&map_val_type);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&keys);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~_Rb_tree(&stats._M_t);
  return;
}

Assistant:

void PhysicalCopyToFile::ReturnStatistics(DataChunk &chunk, idx_t row_idx, CopyToFileInfo &info) {
	auto &file_stats = *info.file_stats;

	// filename VARCHAR
	chunk.SetValue(0, row_idx, info.file_path);
	// count BIGINT
	chunk.SetValue(1, row_idx, Value::UBIGINT(file_stats.row_count));
	// file size bytes BIGINT
	chunk.SetValue(2, row_idx, Value::UBIGINT(file_stats.file_size_bytes));
	// footer size bytes BIGINT
	chunk.SetValue(3, row_idx, file_stats.footer_size_bytes);
	// column statistics map(varchar, map(varchar, varchar))
	map<string, Value> stats;
	for (auto &entry : file_stats.column_statistics) {
		map<string, Value> per_column_stats;
		for (auto &stats_entry : entry.second) {
			per_column_stats.insert(make_pair(stats_entry.first, stats_entry.second));
		}
		vector<Value> stats_keys;
		vector<Value> stats_values;
		for (auto &stats_entry : per_column_stats) {
			stats_keys.emplace_back(stats_entry.first);
			stats_values.emplace_back(std::move(stats_entry.second));
		}
		auto map_value =
		    Value::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR, std::move(stats_keys), std::move(stats_values));
		stats.insert(make_pair(entry.first, std::move(map_value)));
	}
	vector<Value> keys;
	vector<Value> values;
	for (auto &entry : stats) {
		keys.emplace_back(entry.first);
		values.emplace_back(std::move(entry.second));
	}
	auto map_val_type = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	chunk.SetValue(4, row_idx, Value::MAP(LogicalType::VARCHAR, map_val_type, std::move(keys), std::move(values)));

	// partition_keys map(varchar, varchar)
	chunk.SetValue(5, row_idx, info.partition_keys);
}